

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEngine::initialize
          (QNativeSocketEngine *this,SocketType socketType,NetworkLayerProtocol protocol)

{
  bool bVar1;
  QNativeSocketEnginePrivate *this_00;
  ulong uVar2;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  long *plVar3;
  SocketType socketType_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar3 = in_RDI;
  this_00 = d_func((QNativeSocketEngine *)0x25ef02);
  socketType_00 = (SocketType)((ulong)plVar3 >> 0x20);
  uVar2 = (**(code **)(*in_RDI + 0x78))();
  if ((uVar2 & 1) != 0) {
    (**(code **)(*in_RDI + 0xa8))();
  }
  bVar1 = QNativeSocketEnginePrivate::createNewSocket
                    ((QNativeSocketEnginePrivate *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),socketType_00,
                     (NetworkLayerProtocol *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  if (bVar1) {
    if (in_ESI == 1) {
      uVar2 = (**(code **)(*in_RDI + 0x118))(in_RDI,1);
      if ((uVar2 & 1) == 0) {
        QNativeSocketEnginePrivate::setError
                  (this_00,(SocketError)((ulong)in_RDI >> 0x20),(ErrorString)in_RDI);
        (**(code **)(*in_RDI + 0xa8))();
        bVar1 = false;
        goto LAB_0025f00e;
      }
      (**(code **)(*in_RDI + 0x118))(in_RDI,0xc,1);
      (**(code **)(*in_RDI + 0x118))(in_RDI,0xd,1);
    }
    if ((in_ESI == 0) && (uVar2 = (**(code **)(*in_RDI + 0x118))(in_RDI,6,1), (uVar2 & 1) == 0)) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (local_30,"QNativeSocketEngine::initialize unable to inline out-of-band data");
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
LAB_0025f00e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QNativeSocketEngine::initialize(QAbstractSocket::SocketType socketType, QAbstractSocket::NetworkLayerProtocol protocol)
{
    Q_D(QNativeSocketEngine);
    if (isValid())
        close();

    // Create the socket
    if (!d->createNewSocket(socketType, protocol)) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        QString typeStr = "UnknownSocketType"_L1;
        if (socketType == QAbstractSocket::TcpSocket) typeStr = "TcpSocket"_L1;
        else if (socketType == QAbstractSocket::UdpSocket) typeStr = "UdpSocket"_L1;
        else if (socketType == QAbstractSocket::SctpSocket) typeStr = "SctpSocket"_L1;
        QString protocolStr = "UnknownProtocol"_L1;
        if (protocol == QAbstractSocket::IPv4Protocol) protocolStr = "IPv4Protocol"_L1;
        else if (protocol == QAbstractSocket::IPv6Protocol) protocolStr = "IPv6Protocol"_L1;
        qDebug("QNativeSocketEngine::initialize(type == %s, protocol == %s) failed: %s",
               typeStr.toLatin1().constData(), protocolStr.toLatin1().constData(), d->socketErrorString.toLatin1().constData());
#endif
        return false;
    }

    if (socketType == QAbstractSocket::UdpSocket) {
        // Set the broadcasting flag if it's a UDP socket.
        if (!setOption(BroadcastSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                        QNativeSocketEnginePrivate::BroadcastingInitFailedErrorString);
            close();
            return false;
        }

        // Set some extra flags that are interesting to us, but accept failure
        setOption(ReceivePacketInformation, 1);
        setOption(ReceiveHopLimit, 1);
    }


#ifndef Q_OS_WASM
    // Make sure we receive out-of-band data
    if (socketType == QAbstractSocket::TcpSocket
        && !setOption(ReceiveOutOfBandData, 1)) {
        qWarning("QNativeSocketEngine::initialize unable to inline out-of-band data");
    }
#endif

    // Before Qt 4.6, we always set the send and receive buffer size to 49152 as
    // this was found to be an optimal value. However, modern OS
    // all have some kind of auto tuning for this and we therefore don't set
    // this explicitly anymore.
    // If it introduces any performance regressions for Qt 4.6.x (x > 0) then
    // it will be put back in.
    //
    // You can use tests/manual/qhttpnetworkconnection to test HTTP download speed
    // with this.
    //
    // pre-4.6:
    // setReceiveBufferSize(49152);
    // setSendBufferSize(49152);

    return true;
}